

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# learner.cc
# Opt level: O3

void LEARNER::save(vw *all,example *ec)

{
  pointer pcVar1;
  char *pcVar2;
  ostream *poVar3;
  ulong uVar4;
  string final_regressor_name;
  char *local_88;
  long local_80;
  char local_78 [16];
  string local_68;
  undefined1 *local_48 [2];
  undefined1 local_38 [16];
  
  pcVar1 = (all->final_regressor_name)._M_dataplus._M_p;
  local_88 = local_78;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_88,pcVar1,pcVar1 + (all->final_regressor_name)._M_string_length);
  pcVar2 = (ec->tag)._begin;
  uVar4 = (long)(ec->tag)._end - (long)pcVar2;
  if ((5 < uVar4) && (pcVar2[4] == '_')) {
    local_48[0] = local_38;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_48,pcVar2 + 5,pcVar2 + uVar4);
    std::__cxx11::string::operator=((string *)&local_88,(string *)local_48);
    if (local_48[0] != local_38) {
      operator_delete(local_48[0]);
    }
  }
  if (all->quiet == false) {
    std::__ostream_insert<char,std::char_traits<char>>
              (&(all->trace_message).super_ostream,"saving regressor to ",0x14);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       (&(all->trace_message).super_ostream,local_88,local_80);
    std::ios::widen((char)poVar3->_vptr_basic_ostream[-3] + (char)poVar3);
    std::ostream::put((char)poVar3);
    std::ostream::flush();
  }
  local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
  std::__cxx11::string::_M_construct<char*>((string *)&local_68,local_88,local_88 + local_80);
  save_predictor(all,&local_68,0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p);
  }
  VW::finish_example(all,ec);
  if (local_88 != local_78) {
    operator_delete(local_88);
  }
  return;
}

Assistant:

void save(vw& all, example* ec)
{
  // save state command
  string final_regressor_name = all.final_regressor_name;

  if ((ec->tag).size() >= 6 && (ec->tag)[4] == '_')
    final_regressor_name = string(ec->tag.begin() + 5, (ec->tag).size() - 5);

  if (!all.quiet)
    all.trace_message << "saving regressor to " << final_regressor_name << endl;
  save_predictor(all, final_regressor_name, 0);

  VW::finish_example(all, *ec);
}